

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstring.cpp
# Opt level: O3

void __thiscall TPZString::Append(TPZString *this,char *TailIncrement)

{
  char *__s;
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = (this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.
          fNElements;
  if (uVar3 == 0) {
    lVar2 = 0;
  }
  else {
    sVar1 = strlen((this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.
                   fStore);
    lVar2 = (long)(int)sVar1;
  }
  sVar1 = strlen(TailIncrement);
  if (uVar3 < lVar2 + sVar1 + 1) {
    (*(this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>._vptr_TPZVec
      [3])(this);
    uVar3 = (this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.
            fNElements;
  }
  strncpy((this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.fStore +
          lVar2,TailIncrement,uVar3 - lVar2);
  __s = (this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.fStore;
  if ((this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.fNElements ==
      0) {
    sVar1 = 0;
  }
  else {
    sVar1 = strlen(__s);
  }
  __s[sVar1] = '\0';
  return;
}

Assistant:

void TPZString::Append(const char * TailIncrement)
{
	int OldLength = Length();
	size_t len = strlen(TailIncrement);
	
	if (fNElements < OldLength + len + 1) Resize(OldLength + len + 1); // the 1 stands for the null char
	
	strncpy(fStore + OldLength, TailIncrement,fNElements-OldLength);
	fStore[Length()] = '\0'; // just to ensure the string contains a null character
}